

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O0

void __thiscall myvk::Swapchain::~Swapchain(Swapchain *this)

{
  void *in_RDI;
  Swapchain *unaff_retaddr;
  
  ~Swapchain(unaff_retaddr);
  operator_delete(in_RDI,0xb0);
  return;
}

Assistant:

Swapchain::~Swapchain() {
	if (m_swapchain) {
		vkDestroySwapchainKHR(m_graphics_queue_ptr->GetDevicePtr()->GetHandle(), m_swapchain, nullptr);
	}
}